

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O3

bool QXmlUtils::isNameChar(QChar c)

{
  bool bVar1;
  
  bVar1 = rangeContains(g_base_begin,(RangeIter)"_L1",c);
  if (!bVar1) {
    bVar1 = rangeContains(g_digit_begin,(RangeIter)&DAT_004d6f6c,c);
    if ((!bVar1) &&
       ((0x32 < (ushort)(c.ucs + L'ￓ') ||
        ((0x4000000002003U >> ((ulong)(ushort)(c.ucs + L'ￓ') & 0x3f) & 1) == 0)))) {
      bVar1 = rangeContains(g_combining_begin,(RangeIter)&DAT_004d6f2c,c);
      if (!bVar1) {
        bVar1 = rangeContains(g_ideographic_begin,(RangeIter)&DAT_004d6dac,c);
        if (!bVar1) {
          bVar1 = rangeContains(g_extender_begin,(RangeIter)&DAT_004d6f9c,c);
          return bVar1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool QXmlUtils::isNameChar(const QChar c)
{
    return isBaseChar(c)
           || isDigit(c)
           || c.unicode() == '.'
           || c.unicode() == '-'
           || c.unicode() == '_'
           || c.unicode() == ':'
           || isCombiningChar(c)
           || isIdeographic(c)
           || isExtender(c);
}